

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall spvtools::opt::Instruction::Instruction(Instruction *this,IRContext *c,Op op)

{
  uint32_t uVar1;
  Op op_local;
  IRContext *c_local;
  Instruction *this_local;
  
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::IntrusiveNodeBase
            (&this->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00827bf0;
  this->context_ = c;
  this->opcode_ = op;
  this->has_type_id_ = false;
  this->has_result_id_ = false;
  uVar1 = IRContext::TakeNextUniqueId(c);
  this->unique_id_ = uVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&this->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            (&this->dbg_line_insts_);
  DebugScope::DebugScope(&this->dbg_scope_,0,0);
  return;
}

Assistant:

Instruction::Instruction(IRContext* c, spv::Op op)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(op),
      has_type_id_(false),
      has_result_id_(false),
      unique_id_(c->TakeNextUniqueId()),
      dbg_scope_(kNoDebugScope, kNoInlinedAt) {}